

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O0

_Bool x86_opcode_hook_invalidate(uint32_t op,uint32_t flags)

{
  uint32_t flags_local;
  uint32_t op_local;
  
  if (op == 0) {
    if (((flags & 1) == 0) || ((flags & 2) == 0)) {
      flags_local._3_1_ = true;
    }
    else {
      flags_local._3_1_ = false;
    }
  }
  else {
    flags_local._3_1_ = false;
  }
  return flags_local._3_1_;
}

Assistant:

static bool x86_opcode_hook_invalidate(uint32_t op, uint32_t flags)
{
    if (op != UC_TCG_OP_SUB) {
        return false;
    }

    switch (op) {
    case UC_TCG_OP_SUB:

        if ((flags & UC_TCG_OP_FLAG_CMP) && (flags & UC_TCG_OP_FLAG_DIRECT)) {
            return false;
        }

        break;

    default:
        return false;
    }

    return true;
}